

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool cmakeCheckStampFile(string *stampName)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  string stampDepends;
  string stampTemp;
  ostringstream stampTempStream;
  cmFileTimeCache ftc;
  ifstream fin;
  string local_5f0;
  string local_5d0;
  undefined1 local_5b0 [112];
  ios_base local_540 [264];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [14];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  pcVar1 = (stampName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5f0,pcVar1,pcVar1 + stampName->_M_string_length);
  std::__cxx11::string::append((char *)&local_5f0);
  std::ifstream::ifstream(local_238,local_5f0._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    cmFileTimeCache::cmFileTimeCache((cmFileTimeCache *)local_438);
    local_5b0._0_8_ = local_5b0 + 0x10;
    local_5b0._8_8_ = 0;
    local_5b0[0x10] = '\0';
    do {
      do {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_238,(string *)local_5b0,(bool *)0x0,-1);
        if (!bVar2) {
          if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
            operator_delete((void *)local_5b0._0_8_,CONCAT71(local_5b0._17_7_,local_5b0[0x10]) + 1);
          }
          cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)local_438);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_5b0,(stampName->_M_dataplus)._M_p,
                              stampName->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,".tmp",4);
          cmSystemTools::RandomSeed();
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__cxx11::stringbuf::str();
          std::ofstream::ofstream
                    (local_438,
                     (char *)CONCAT44(local_5d0._M_dataplus._M_p._4_4_,
                                      (int)local_5d0._M_dataplus._M_p),_S_out);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,"# CMake generation timestamp file for this directory.\n",
                     0x36);
          local_438._0_8_ = _VTT;
          *(undefined8 *)(local_438 + (&_VTT->_M_allocated_capacity)[-3]) = _vtable;
          std::filebuf::~filebuf((filebuf *)(local_438 + 8));
          std::ios_base::~ios_base(local_340);
          bVar2 = cmSystemTools::RenameFile(&local_5d0,stampName);
          if (!bVar2) {
            cmsys::SystemTools::RemoveFile(&local_5d0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_438,"Cannot restore timestamp ",stampName);
            cmSystemTools::Error((string *)local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._0_8_ != local_428) {
              operator_delete((void *)local_438._0_8_,
                              (ulong)(local_428[0]._M_allocated_capacity + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_5d0._M_dataplus._M_p._4_4_,(int)local_5d0._M_dataplus._M_p) !=
              &local_5d0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_5d0._M_dataplus._M_p._4_4_,
                                     (int)local_5d0._M_dataplus._M_p),
                            local_5d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          std::ios_base::~ios_base(local_540);
          goto LAB_001920e9;
        }
      } while ((local_5b0._8_8_ == 0) || (*(char *)local_5b0._0_8_ == '#'));
      bVar2 = cmFileTimeCache::Compare
                        ((cmFileTimeCache *)local_438,&local_5f0,(string *)local_5b0,
                         (int *)&local_5d0);
    } while (bVar2 && -1 < (int)local_5d0._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CMake is re-running because ",0x1c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(stampName->_M_dataplus)._M_p,
                        stampName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is out-of-date.\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  the file \'",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_5b0._0_8_,local_5b0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  is newer than \'",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_5f0._M_dataplus._M_p,local_5f0._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  result=\'",10);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_5d0._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
      operator_delete((void *)local_5b0._0_8_,CONCAT71(local_5b0._17_7_,local_5b0[0x10]) + 1);
    }
    cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)local_438);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CMake is re-running because ",0x1c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(stampName->_M_dataplus)._M_p,
                        stampName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," dependency file is missing.\n",0x1d)
    ;
  }
  bVar2 = false;
LAB_001920e9:
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

static bool cmakeCheckStampFile(const std::string& stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = stampName;
  stampDepends += ".depend";
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str());
#endif
  if (!fin) {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
  }

  // Compare the stamp dependencies against the dependency file itself.
  {
    cmFileTimeCache ftc;
    std::string dep;
    while (cmSystemTools::GetLineFromStream(fin, dep)) {
      int result;
      if (!dep.empty() && dep[0] != '#' &&
          (!ftc.Compare(stampDepends, dep, &result) || result < 0)) {
        // The stamp depends file is older than this dependency.  The
        // build system is really out of date.
        std::cout << "CMake is re-running because " << stampName
                  << " is out-of-date.\n";
        std::cout << "  the file '" << dep << "'\n";
        std::cout << "  is newer than '" << stampDepends << "'\n";
        std::cout << "  result='" << result << "'\n";
        return false;
      }
    }
  }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTemp = stampTempStream.str();
  {
    // TODO: Teach cmGeneratedFileStream to use a random temp file (with
    // multiple tries in unlikely case of conflict) and use that here.
    cmsys::ofstream stamp(stampTemp.c_str());
    stamp << "# CMake generation timestamp file for this directory.\n";
  }
  if (cmSystemTools::RenameFile(stampTemp, stampName)) {
    // CMake does not need to re-run because the stamp file is up-to-date.
    return true;
  }
  cmSystemTools::RemoveFile(stampTemp);
  cmSystemTools::Error("Cannot restore timestamp " + stampName);
  return false;
}